

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

mem_hash_record * MemHashGetEntry(mem_hash_kv_engine *pEngine,void *pKey,int nKeyLen)

{
  sxu32 sVar1;
  sxi32 sVar2;
  mem_hash_record *pmVar3;
  
  sVar1 = (*pEngine->xHash)(pKey,nKeyLen);
  pmVar3 = pEngine->apBucket[pEngine->nBucket - 1 & sVar1];
  while( true ) {
    if (pmVar3 == (mem_hash_record *)0x0) {
      return (mem_hash_record *)0x0;
    }
    if (((pmVar3->nHash == sVar1) && (pmVar3->nKeyLen == nKeyLen)) &&
       (sVar2 = (*pEngine->xCmp)(pmVar3->pKey,pKey,nKeyLen), sVar2 == 0)) break;
    pmVar3 = pmVar3->pNextHash;
  }
  return pmVar3;
}

Assistant:

static mem_hash_record * MemHashGetEntry(
	mem_hash_kv_engine *pEngine,
	const void *pKey,int nKeyLen
	)
{
	mem_hash_record *pEntry;
	sxu32 nHash,nBucket;
	/* Hash the entry */
	nHash = pEngine->xHash(pKey,(sxu32)nKeyLen);
	nBucket = nHash & (pEngine->nBucket - 1);
	pEntry = pEngine->apBucket[nBucket];
	for(;;){
		if( pEntry == 0 ){
			break;
		}
		if( pEntry->nHash == nHash && pEntry->nKeyLen == (sxu32)nKeyLen && 
			pEngine->xCmp(pEntry->pKey,pKey,pEntry->nKeyLen) == 0 ){
				return pEntry;
		}
		pEntry = pEntry->pNextHash;
	}
	/* No such entry */
	return 0;
}